

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

string * __thiscall
LinkedObjectFile::get_goal_string_abi_cxx11_
          (string *__return_storage_ptr__,LinkedObjectFile *this,int seg,int word_idx)

{
  pointer pvVar1;
  reference pvVar2;
  reference pvVar3;
  ulong uVar4;
  char cword [4];
  string result;
  
  std::__cxx11::string::string((string *)&result,"\"",(allocator *)cword);
  pvVar1 = (this->words_by_seg).
           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (word_idx + 1 <
      (int)(((long)*(pointer *)
                    ((long)&pvVar1[seg].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                            _M_impl.super__Vector_impl_data + 8) -
            *(long *)&pvVar1[seg].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                      _M_impl.super__Vector_impl_data) / 0x30)) {
    pvVar2 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                       (pvVar1 + seg,(long)(word_idx + 1));
    if (pvVar2->kind == PLAIN_DATA) {
      for (uVar4 = 0; uVar4 < pvVar2->data; uVar4 = uVar4 + 1) {
        pvVar3 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                           ((this->words_by_seg).
                            super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + seg,
                            (long)((int)(uVar4 >> 2) + word_idx + 2));
        if (pvVar3->kind != PLAIN_DATA) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"invalid string! (check me!)\n",
                     (allocator *)cword);
          goto LAB_0013b6e0;
        }
        cword = (char  [4])pvVar3->data;
        std::__cxx11::string::push_back((char)&result);
      }
      std::operator+(__return_storage_ptr__,&result,"\"");
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"invalid string!\n",(allocator *)cword);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"invalid string!\n",(allocator *)cword);
  }
LAB_0013b6e0:
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string LinkedObjectFile::get_goal_string(int seg, int word_idx) {
  std::string result = "\"";
  // next should be the size
  if (word_idx + 1 >= int(words_by_seg[seg].size())) {
    return "invalid string!\n";
  }
  LinkedWord& size_word = words_by_seg[seg].at(word_idx + 1);
  if (size_word.kind != LinkedWord::PLAIN_DATA) {
    // sometimes an array of string pointer triggers this!
    return "invalid string!\n";
  }

  //  result += "(size " + std::to_string(size_word.data) + "): ";
  // now characters...
  for (size_t i = 0; i < size_word.data; i++) {
    int word_offset = word_idx + 2 + (i / 4);
    int byte_offset = i % 4;
    auto& word = words_by_seg[seg].at(word_offset);
    if (word.kind != LinkedWord::PLAIN_DATA) {
      return "invalid string! (check me!)\n";
    }
    char cword[4];
    memcpy(cword, &word.data, 4);
    result += cword[byte_offset];
  }
  return result + "\"";
}